

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionTest.cpp
# Opt level: O0

void __thiscall
AssertionTest_assertNeHandlerShouldNotBeCalled_Test::
AssertionTest_assertNeHandlerShouldNotBeCalled_Test
          (AssertionTest_assertNeHandlerShouldNotBeCalled_Test *this)

{
  AssertionTest_assertNeHandlerShouldNotBeCalled_Test *this_local;
  
  AssertionTest::AssertionTest(&this->super_AssertionTest);
  (this->super_AssertionTest).super_Test._vptr_Test =
       (_func_int **)&PTR__AssertionTest_assertNeHandlerShouldNotBeCalled_Test_001d1f68;
  return;
}

Assistant:

TEST_F(AssertionTest, assertNeHandlerShouldNotBeCalled)
{
    std::int32_t a = 0;
    std::int32_t b = 1;
    CPP_ASSERT_NE(a, b);
    EXPECT_EQ(0, assertionHandlerCounter_);

    SET_EXPECTED_MSG(a, b);
    CPP_ASSERT_NE(a, b, EXPECTED_TEST_MSG(a,b));
    EXPECT_EQ(0, assertionHandlerCounter_);
}